

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void skewness_api_suite::test_full(void)

{
  boost::detail::test_impl
            ("!filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1ed,"void skewness_api_suite::test_full()",true);
  boost::detail::test_impl
            ("!filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1f1,"void skewness_api_suite::test_full()",true);
  boost::detail::test_impl
            ("filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,499,"void skewness_api_suite::test_full()",true);
  boost::detail::test_impl
            ("filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1f5,"void skewness_api_suite::test_full()",true);
  return;
}

Assistant:

void test_full()
{
    interim::moment_skewness<double, 4> filter;
    TRIAL_TEST(!filter.full());
    filter.push(1.0);
    filter.push(2.0);
    filter.push(3.0);
    TRIAL_TEST(!filter.full());
    filter.push(4.0);
    TRIAL_TEST(filter.full());
    filter.push(5.0);
    TRIAL_TEST(filter.full());
}